

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NPrintNamespaces(xmlNs *ns,xmlC14NCtxPtr ctx)

{
  xmlC14NCtxPtr ctx_local;
  xmlNs *ns_local;
  
  if ((ns == (xmlNs *)0x0) || (ctx == (xmlC14NCtxPtr)0x0)) {
    xmlC14NErrParam(ctx);
    ns_local._4_4_ = 0;
  }
  else {
    if (ns->prefix == (xmlChar *)0x0) {
      xmlOutputBufferWriteString(ctx->buf," xmlns=");
    }
    else {
      xmlOutputBufferWriteString(ctx->buf," xmlns:");
      xmlOutputBufferWriteString(ctx->buf,(char *)ns->prefix);
      xmlOutputBufferWriteString(ctx->buf,"=");
    }
    if (ns->href == (xmlChar *)0x0) {
      xmlOutputBufferWriteString(ctx->buf,"\"\"");
    }
    else {
      xmlOutputBufferWriteQuotedString(ctx->buf,ns->href);
    }
    ns_local._4_4_ = 1;
  }
  return ns_local._4_4_;
}

Assistant:

static int
xmlC14NPrintNamespaces(const xmlNs *ns, xmlC14NCtxPtr ctx)
{

    if ((ns == NULL) || (ctx == NULL)) {
        xmlC14NErrParam(ctx);
        return 0;
    }

    if (ns->prefix != NULL) {
        xmlOutputBufferWriteString(ctx->buf, " xmlns:");
        xmlOutputBufferWriteString(ctx->buf, (const char *) ns->prefix);
        xmlOutputBufferWriteString(ctx->buf, "=");
    } else {
        xmlOutputBufferWriteString(ctx->buf, " xmlns=");
    }
    if(ns->href != NULL) {
	xmlOutputBufferWriteQuotedString(ctx->buf, ns->href);
    } else {
    	xmlOutputBufferWriteString(ctx->buf, "\"\"");
    }
    return (1);
}